

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O2

lzham_malloc_context lzham::lzham_create_malloc_context(uint arena_size)

{
  undefined4 *puVar1;
  
  puVar1 = (undefined4 *)(*(code *)g_pRealloc)(0,(ulong)arena_size + 0x47,0,1,g_pUser_data);
  *(undefined8 *)(puVar1 + 2) = 0;
  *puVar1 = 0x5749abcd;
  puVar1[1] = arena_size;
  puVar1[0xc] = 0;
  *(undefined8 *)(puVar1 + 4) = 0;
  *(undefined8 *)(puVar1 + 6) = 0;
  *(undefined8 *)(puVar1 + 8) = 0;
  *(undefined8 *)(puVar1 + 10) = 0;
  if (arena_size != 0) {
    puVar1[0xc] = -(int)puVar1 - 0x34U & 0xc;
  }
  return puVar1;
}

Assistant:

lzham_malloc_context lzham_create_malloc_context(uint arena_size)
   {
      malloc_context *p = static_cast<malloc_context *>((*g_pRealloc)(NULL, (sizeof(malloc_context) - 1) + arena_size + LZHAM_MIN_ALLOC_ALIGNMENT, NULL, true, g_pUser_data));
      helpers::construct(p);
      p->init(arena_size);
      return p;
   }